

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinUtil.c
# Opt level: O2

void Min_CoverWriteFile(Min_Cube_t *pCover,char *pName,int fEsop)

{
  Min_Cube_t *pCube;
  size_t sVar1;
  ulong uVar2;
  FILE *__stream;
  char *pcVar3;
  Min_Cube_t *pMVar4;
  uint uVar5;
  char *pcVar6;
  int Count;
  char Buffer [1000];
  
  pcVar6 = "esop";
  if (fEsop == 0) {
    pcVar6 = "pla";
  }
  sprintf(Buffer,"%s.%s",pName,pcVar6);
  sVar1 = strlen(Buffer);
  uVar2 = sVar1 & 0xffffffff;
  while( true ) {
    uVar2 = uVar2 - 1;
    if ((int)(uint)uVar2 < 0) break;
    uVar5 = (uint)uVar2 & 0x7fffffff;
    if ((byte)(Buffer[uVar5] | 2U) == 0x3e) {
      Buffer[uVar5] = '_';
    }
  }
  __stream = fopen(Buffer,"w");
  pcVar6 = "ESOP";
  if (fEsop == 0) {
    pcVar6 = "SOP";
  }
  uVar5 = 0;
  pcVar3 = Extra_TimeStamp();
  fprintf(__stream,"# %s cover for output %s generated by ABC on %s\n",pcVar6,pName,pcVar3);
  uVar2 = 0;
  if (pCover != (Min_Cube_t *)0x0) {
    uVar2 = (ulong)(*(uint *)&pCover->field_0x8 & 0x3ff);
  }
  fprintf(__stream,".i %d\n",uVar2);
  fprintf(__stream,".o %d\n",1);
  for (pMVar4 = pCover; pMVar4 != (Min_Cube_t *)0x0; pMVar4 = pMVar4->pNext) {
    uVar5 = uVar5 + 1;
  }
  fprintf(__stream,".p %d\n",(ulong)uVar5);
  if (fEsop != 0) {
    fwrite(".type esop\n",0xb,1,__stream);
  }
  for (; pCover != (Min_Cube_t *)0x0; pCover = pCover->pNext) {
    Min_CubeWrite((FILE *)__stream,pCover);
  }
  fwrite(".e\n",3,1,__stream);
  fclose(__stream);
  return;
}

Assistant:

void Min_CoverWriteFile( Min_Cube_t * pCover, char * pName, int fEsop )
{
    char Buffer[1000];
    Min_Cube_t * pCube;
    FILE * pFile;
    int i;
    sprintf( Buffer, "%s.%s", pName, fEsop? "esop" : "pla" );
    for ( i = strlen(Buffer) - 1; i >= 0; i-- )
        if ( Buffer[i] == '<' || Buffer[i] == '>' )
            Buffer[i] = '_';
    pFile = fopen( Buffer, "w" );
    fprintf( pFile, "# %s cover for output %s generated by ABC on %s\n", fEsop? "ESOP":"SOP", pName, Extra_TimeStamp() );
    fprintf( pFile, ".i %d\n", pCover? pCover->nVars : 0 );
    fprintf( pFile, ".o %d\n", 1 );
    fprintf( pFile, ".p %d\n", Min_CoverCountCubes(pCover) );
    if ( fEsop ) fprintf( pFile, ".type esop\n" );
    Min_CoverForEachCube( pCover, pCube )
        Min_CubeWrite( pFile, pCube );
    fprintf( pFile, ".e\n" );
    fclose( pFile );
}